

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprNearset *
sqlite3Fts5ParseNearset(Fts5Parse *pParse,Fts5ExprNearset *pNear,Fts5ExprPhrase *pPhrase)

{
  int iVar1;
  Fts5ExprPhrase *pPhrase_00;
  Fts5ExprPhrase *pLast;
  sqlite3_int64 nByte_1;
  int nNew;
  sqlite3_int64 nByte;
  Fts5ExprNearset *pRet;
  Fts5ExprPhrase *pFStack_28;
  int SZALLOC;
  Fts5ExprPhrase *pPhrase_local;
  Fts5ExprNearset *pNear_local;
  Fts5Parse *pParse_local;
  
  nByte = 0;
  if (pParse->rc == 0) {
    if (pPhrase == (Fts5ExprPhrase *)0x0) {
      return pNear;
    }
    if (pNear == (Fts5ExprNearset *)0x0) {
      nByte = (sqlite3_int64)sqlite3_malloc64(0x60);
      if ((void *)nByte == (void *)0x0) {
        pParse->rc = 7;
      }
      else {
        memset((void *)nByte,0,0x60);
      }
    }
    else {
      nByte = (sqlite3_int64)pNear;
      if ((pNear->nPhrase % 8 == 0) &&
         (nByte = (sqlite3_int64)sqlite3_realloc64(pNear,(long)(pNear->nPhrase + 8) * 8 + 0x20),
         (void *)nByte == (void *)0x0)) {
        pParse->rc = 7;
      }
    }
  }
  if (nByte == 0) {
    sqlite3Fts5ParseNearsetFree(pNear);
    sqlite3Fts5ParsePhraseFree(pPhrase);
  }
  else {
    pFStack_28 = pPhrase;
    if (0 < *(int *)(nByte + 0x10)) {
      pPhrase_00 = *(Fts5ExprPhrase **)(nByte + 0x18 + (long)(*(int *)(nByte + 0x10) + -1) * 8);
      if (pPhrase->nTerm == 0) {
        fts5ExprPhraseFree(pPhrase);
        *(int *)(nByte + 0x10) = *(int *)(nByte + 0x10) + -1;
        pParse->nPhrase = pParse->nPhrase + -1;
        pFStack_28 = pPhrase_00;
      }
      else {
        pFStack_28 = pPhrase;
        if (pPhrase_00->nTerm == 0) {
          fts5ExprPhraseFree(pPhrase_00);
          pParse->apPhrase[pParse->nPhrase + -2] = pPhrase;
          pParse->nPhrase = pParse->nPhrase + -1;
          *(int *)(nByte + 0x10) = *(int *)(nByte + 0x10) + -1;
        }
      }
    }
    iVar1 = *(int *)(nByte + 0x10);
    *(int *)(nByte + 0x10) = iVar1 + 1;
    *(Fts5ExprPhrase **)(nByte + 0x18 + (long)iVar1 * 8) = pFStack_28;
  }
  return (Fts5ExprNearset *)nByte;
}

Assistant:

static Fts5ExprNearset *sqlite3Fts5ParseNearset(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprNearset *pNear,         /* Existing nearset, or NULL */
  Fts5ExprPhrase *pPhrase         /* Recently parsed phrase */
){
  const int SZALLOC = 8;
  Fts5ExprNearset *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    if( pPhrase==0 ){
      return pNear;
    }
    if( pNear==0 ){
      sqlite3_int64 nByte;
      nByte = sizeof(Fts5ExprNearset) + SZALLOC * sizeof(Fts5ExprPhrase*);
      pRet = sqlite3_malloc64(nByte);
      if( pRet==0 ){
        pParse->rc = SQLITE_NOMEM;
      }else{
        memset(pRet, 0, (size_t)nByte);
      }
    }else if( (pNear->nPhrase % SZALLOC)==0 ){
      int nNew = pNear->nPhrase + SZALLOC;
      sqlite3_int64 nByte;

      nByte = sizeof(Fts5ExprNearset) + nNew * sizeof(Fts5ExprPhrase*);
      pRet = (Fts5ExprNearset*)sqlite3_realloc64(pNear, nByte);
      if( pRet==0 ){
        pParse->rc = SQLITE_NOMEM;
      }
    }else{
      pRet = pNear;
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNearsetFree(pNear);
    sqlite3Fts5ParsePhraseFree(pPhrase);
  }else{
    if( pRet->nPhrase>0 ){
      Fts5ExprPhrase *pLast = pRet->apPhrase[pRet->nPhrase-1];
      assert( pLast==pParse->apPhrase[pParse->nPhrase-2] );
      if( pPhrase->nTerm==0 ){
        fts5ExprPhraseFree(pPhrase);
        pRet->nPhrase--;
        pParse->nPhrase--;
        pPhrase = pLast;
      }else if( pLast->nTerm==0 ){
        fts5ExprPhraseFree(pLast);
        pParse->apPhrase[pParse->nPhrase-2] = pPhrase;
        pParse->nPhrase--;
        pRet->nPhrase--;
      }
    }
    pRet->apPhrase[pRet->nPhrase++] = pPhrase;
  }
  return pRet;
}